

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O2

RangeValue __thiscall CoreML::RangeValue::operator*(RangeValue *this,RangeValue *other)

{
  undefined8 extraout_RAX;
  size_t other_00;
  RangeValue RVar1;
  RangeValue retval;
  RangeValue local_20;
  
  RangeValue(&local_20);
  if (other->_isUnbound == true) {
    RVar1._1_7_ = (int7)((ulong)extraout_RAX >> 8);
    RVar1._isUnbound = local_20._isUnbound;
    RVar1._val = local_20._val;
  }
  else {
    other_00 = value(other);
    RVar1 = operator*(this,other_00);
  }
  return RVar1;
}

Assistant:

RangeValue RangeValue::operator* (const RangeValue& other) const {
    RangeValue retval;
    if (other.isUnbound())
        return retval;
    else {
        return (*this)*other.value();
    }
}